

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O2

void __thiscall
icu_63::anon_unknown_5::DecFmtSymDataSink::put
          (DecFmtSymDataSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  DecimalFormatSymbols *this_00;
  char *__s1;
  UErrorCode *pUVar1;
  UBool UVar2;
  int iVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  int32_t j;
  int i;
  undefined **ppuVar5;
  char *key_local;
  UErrorCode *local_a0;
  ResourceTable symbolsTable;
  UnicodeString local_70;
  
  key_local = key;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&symbolsTable,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    i = 0;
    local_a0 = errorCode;
    while (UVar2 = ResourceTable::getKeyAndValue(&symbolsTable,i,&key_local,value), __s1 = key_local
          , UVar2 != '\0') {
      ppuVar5 = &gNumberElementKeys;
      for (uVar4 = 0; uVar4 != 0x1c; uVar4 = uVar4 + 1) {
        if (((0x7fd2334UL >> (uVar4 & 0x3f) & 1) == 0) &&
           (iVar3 = strcmp(__s1,*ppuVar5), pUVar1 = local_a0, iVar3 == 0)) {
          if (this->seenSymbol[uVar4] == '\0') {
            this->seenSymbol[uVar4] = '\x01';
            this_00 = this->dfs;
            ResourceValue::getUnicodeString(&local_70,value,local_a0);
            DecimalFormatSymbols::setSymbol(this_00,(ENumberFormatSymbol)uVar4,&local_70,'\x01');
            icu_63::UnicodeString::~UnicodeString(&local_70);
            if (U_ZERO_ERROR < *pUVar1) {
              return;
            }
          }
          break;
        }
        ppuVar5 = ppuVar5 + 1;
      }
      i = i + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable symbolsTable = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int32_t j = 0; symbolsTable.getKeyAndValue(j, key, value); ++j) {
            for (int32_t i=0; i<DecimalFormatSymbols::kFormatSymbolCount; i++) {
                if (gNumberElementKeys[i] != NULL && uprv_strcmp(key, gNumberElementKeys[i]) == 0) {
                    if (!seenSymbol[i]) {
                        seenSymbol[i] = TRUE;
                        dfs.setSymbol(
                            (DecimalFormatSymbols::ENumberFormatSymbol) i,
                            value.getUnicodeString(errorCode));
                        if (U_FAILURE(errorCode)) { return; }
                    }
                    break;
                }
            }
        }
    }